

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r,secp256k1_scalar *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_scalar *in_RSI;
  ulong *in_RDI;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t a0;
  uint64_t M62;
  
  uVar1 = in_RSI->d[0];
  uVar2 = in_RSI->d[1];
  uVar3 = in_RSI->d[2];
  uVar4 = in_RSI->d[3];
  secp256k1_scalar_verify(in_RSI);
  *in_RDI = uVar1 & 0x3fffffffffffffff;
  in_RDI[1] = uVar1 >> 0x3e | (uVar2 & 0xfffffffffffffff) << 2;
  in_RDI[2] = uVar2 >> 0x3c | (uVar3 & 0x3ffffffffffffff) << 4;
  in_RDI[3] = uVar3 >> 0x3a | (uVar4 & 0xffffffffffffff) << 6;
  in_RDI[4] = uVar4 >> 0x38;
  return;
}

Assistant:

static void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r, const secp256k1_scalar *a) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const uint64_t a0 = a->d[0], a1 = a->d[1], a2 = a->d[2], a3 = a->d[3];
    SECP256K1_SCALAR_VERIFY(a);

    r->v[0] =  a0                   & M62;
    r->v[1] = (a0 >> 62 | a1 <<  2) & M62;
    r->v[2] = (a1 >> 60 | a2 <<  4) & M62;
    r->v[3] = (a2 >> 58 | a3 <<  6) & M62;
    r->v[4] =  a3 >> 56;
}